

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nassa_e_contro.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long ****pppplVar1;
  allocator<char> aaVar2 [4];
  long *plVar3;
  _List_node_base *p_Var4;
  short *psVar5;
  ostream *this;
  uint uVar6;
  int iVar7;
  long ****pppplVar8;
  int iVar9;
  int x;
  list<short,_std::allocator<short>_> serie;
  string sFilename;
  array<short,_17UL> cavalli;
  ifstream inFile;
  int local_2a8;
  allocator<char> local_2a4 [4];
  long ***local_2a0;
  long ***local_298;
  long local_290;
  long *local_288;
  long local_280;
  long local_278 [2];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined2 local_248;
  short local_246 [7];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_258 = 0x19001600150012;
  uStack_250 = 0x1d001c;
  local_268 = 0xf000c00030000;
  uStack_260 = 0x7000400230020;
  local_248 = 0;
  local_2a0 = (long ***)&local_2a0;
  local_290 = 0;
  local_298 = local_2a0;
  std::ifstream::ifstream(local_238);
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,argv[1],local_2a4);
    std::ifstream::open((string *)local_238,(_Ios_Openmode)&local_288);
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
      std::operator<<((ostream *)&std::cerr,"Unable to open file datafile.txt");
      exit(1);
    }
    while (plVar3 = (long *)std::istream::operator>>((istream *)local_238,(int *)local_2a4),
          aaVar2 = local_2a4, (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0
          ) {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      *(short *)&p_Var4[1]._M_next = aaVar2._0_2_;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      local_290 = local_290 + 1;
    }
    std::ifstream::close();
    if ((long ****)local_2a0 == &local_2a0) {
      local_2a8 = 0;
      iVar9 = 0;
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      iVar9 = 0;
      local_2a8 = 0;
      pppplVar8 = (long ****)local_2a0;
      do {
        psVar5 = std::__find_if<short*,__gnu_cxx::__ops::_Iter_equals_val<short_const>>
                           (&local_268,local_246,pppplVar8 + 2);
        uVar6 = (uint)*(ushort *)(pppplVar8 + 2);
        if ((uVar6 < 0x1b) && ((0x4080004U >> (uVar6 & 0x1f) & 1) != 0)) {
          iVar7 = iVar7 + 0xfa;
LAB_00101444:
          iVar9 = iVar9 + 1;
        }
        else {
          if (psVar5 != local_246) {
            iVar7 = iVar7 + 0x46;
            goto LAB_00101444;
          }
          iVar7 = iVar7 + -100;
          local_2a8 = local_2a8 + 1;
        }
        pppplVar8 = (long ****)*pppplVar8;
      } while (pppplVar8 != &local_2a0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_288,local_280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Win:",5);
    *(undefined8 *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) = 5;
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(this," Loss:",6);
    *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 5;
    std::ostream::operator<<(this,local_2a8);
    *(undefined8 *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) = 5;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Balance:",9);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    iVar7 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"example: roulette serie.txt",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
    std::ostream::put(-0x20);
    iVar7 = -1;
    std::ostream::flush();
  }
  std::ifstream::~ifstream(local_238);
  pppplVar8 = (long ****)local_2a0;
  while (pppplVar8 != &local_2a0) {
    pppplVar1 = (long ****)*pppplVar8;
    operator_delete(pppplVar8,0x18);
    pppplVar8 = pppplVar1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char *argv[])
{
    // your code goes here
    //nassa = 0/3-12/15-19-26-32/35
    //contro nassa = 2-4/7-18/21-22/25-28/29 

    std::array<short, 17> cavalli{{0,3,12,15,32,35,4,7,18,21,22,25,28,29}};
    std::array<short, 3> pieno{{2,19,26}};
    std::list<short> serie;
    ifstream inFile;
    if (argc!=2)
    {
        std::cerr<<"example: roulette serie.txt"<<std::endl;
        return -1;
    }

    std::string sFilename(argv[1]);
    inFile.open(sFilename);
    if (!inFile)
    {
        std::cerr << "Unable to open file datafile.txt";
        exit(1); // call system to stop
    }
    int x;
    while (inFile >> x)
    {
        //std::cout<<x<<std::endl;
        serie.push_back(x);
    }
    inFile.close();

    int maxperdita;
    int balance=0;
    int win=0;
    int loss=0;
    for (short &estratto : serie)
    {
        
        bool bIsCavallo = std::find(std::begin(cavalli), std::end(cavalli), estratto) != std::end(cavalli);
        bool bIsPieno = std::find(std::begin(pieno), std::end(pieno), estratto) != std::end(pieno);

        if (bIsPieno)
        {
            balance+=250;
            win++;
        }
        else if (bIsCavallo) 
        {
            balance+=70;
            win++;
        }
        else
        { 
            balance-=100;
            loss++;
        }
    }
    std::cout << sFilename;
    std::cout << " Win:" << std::setw(5)<<win<< " Loss:" <<std::setw(5)<< loss;
    std::cout <<std::setw(5)<< " Balance:" << balance << std::endl;
    return 0;
}